

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O2

bool draco::ReadFileToString(string *file_name,string *contents)

{
  bool bVar1;
  vector<char,_std::allocator<char>_> buffer;
  undefined1 local_40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_30;
  
  if ((contents == (string *)0x0) ||
     (FileReaderFactory::OpenReader((string *)local_40), (long *)local_40._0_8_ == (long *)0x0)) {
    return false;
  }
  local_40._8_8_ = (char *)0x0;
  aStack_30._M_allocated_capacity = 0;
  aStack_30._8_8_ = 0;
  bVar1 = ReadFileToBuffer(file_name,(vector<char,_std::allocator<char>_> *)(local_40 + 8));
  if (bVar1) {
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)contents,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_40._8_8_,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               aStack_30._M_allocated_capacity);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)(local_40 + 8));
  if ((long *)local_40._0_8_ == (long *)0x0) {
    return bVar1;
  }
  (**(code **)(*(long *)local_40._0_8_ + 8))();
  return bVar1;
}

Assistant:

bool ReadFileToString(const std::string &file_name, std::string *contents) {
  if (!contents) {
    return false;
  }
  std::unique_ptr<FileReaderInterface> file_reader =
      FileReaderFactory::OpenReader(file_name);
  if (file_reader == nullptr) {
    return false;
  }
  std::vector<char> buffer;
  if (!ReadFileToBuffer(file_name, &buffer)) {
    return false;
  }
  contents->assign(buffer.begin(), buffer.end());
  return true;
}